

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O0

bool CoreML::Specification::OneHotEncoder_HandleUnknown_Parse
               (ConstStringParam name,OneHotEncoder_HandleUnknown *value)

{
  bool bVar1;
  int *in_R9;
  StringPiece name_00;
  StringPiece local_30;
  OneHotEncoder_HandleUnknown local_1c;
  bool success;
  OneHotEncoder_HandleUnknown *pOStack_18;
  int int_value;
  OneHotEncoder_HandleUnknown *value_local;
  ConstStringParam name_local;
  
  pOStack_18 = value;
  value_local = (OneHotEncoder_HandleUnknown *)name;
  google::protobuf::stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_30,name);
  name_00.length_ = (size_type)&local_1c;
  name_00.ptr_ = (char *)local_30.length_;
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((internal *)OneHotEncoder_HandleUnknown_entries,(EnumEntry *)0x2,
                     (size_t)local_30.ptr_,name_00,in_R9);
  if (bVar1) {
    *pOStack_18 = local_1c;
  }
  return bVar1;
}

Assistant:

bool OneHotEncoder_HandleUnknown_Parse(
    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, OneHotEncoder_HandleUnknown* value) {
  int int_value;
  bool success = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumValue(
      OneHotEncoder_HandleUnknown_entries, 2, name, &int_value);
  if (success) {
    *value = static_cast<OneHotEncoder_HandleUnknown>(int_value);
  }
  return success;
}